

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O2

RC __thiscall PF_HashTable::Find(PF_HashTable *this,int fd,PageNum pageNum,int *slot)

{
  ulong uVar1;
  RC RVar2;
  PF_HashEntry *pPVar3;
  
  uVar1 = (long)(pageNum + fd) % (long)this->numBuckets;
  RVar2 = -8;
  if (-1 < (int)uVar1) {
    pPVar3 = (PF_HashEntry *)(this->hashTable + (uVar1 & 0xffffffff));
    do {
      pPVar3 = pPVar3->next;
      if (pPVar3 == (PF_HashEntry *)0x0) {
        return -8;
      }
    } while ((pPVar3->fd != fd) || (pPVar3->pageNum != pageNum));
    *slot = pPVar3->slot;
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

RC PF_HashTable::Find(int fd, PageNum pageNum, int &slot)
{
  // Get which bucket it should be in
  int bucket = Hash(fd, pageNum);

  if (bucket<0)
     return (PF_HASHNOTFOUND);

  // Go through the linked list of this bucket
  for (PF_HashEntry *entry = hashTable[bucket];
       entry != NULL;
       entry = entry->next) {
    if (entry->fd == fd && entry->pageNum == pageNum) {

      // Found it
      slot = entry->slot;
      return (0);
    }
  }

  // Didn't find it
  return (PF_HASHNOTFOUND);
}